

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_seh.cpp
# Opt level: O1

void testSEH(void)

{
  ModuleID local_10;
  
  initTranslator();
  badCallOuter_Nullptr();
  local_10.str = (char *)0x0;
  nodecpp::log::default_log::log<char_const*>(&local_10,info,"... and still working [1]");
  badCallOuter_AnyPtr();
  local_10.str = (char *)0x0;
  nodecpp::log::default_log::log<char_const*>(&local_10,info,"... and still working [2]");
  return;
}

Assistant:

void testSEH()
{
    initTranslator();

    try
    {
		badCallOuter_Nullptr();
    }
    catch (std::exception& e)
    {
        nodecpp::log::default_log::info("{}", e.what() );
    }

    nodecpp::log::default_log::info("... and still working [1]" );

    try
    {
		badCallOuter_AnyPtr();
	}
    catch (std::exception& e)
    {
        nodecpp::log::default_log::info("{}", e.what() );
    }

    nodecpp::log::default_log::info("... and still working [2]" );
	
    /*try 
	{
		badCallOuter_DivByZero();
	}
	catch( std::exception& e )
	{
		nodecpp::log::default_log::info("{}", e.what() );
	}

    nodecpp::log::default_log::info("... and still working [3]" );*/
}